

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderMultisampleInterpolationTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::SampleQualifierRenderCase::
getIterationDescription_abi_cxx11_(string *__return_storage_ptr__,void *this,int iteration)

{
  allocator<char> local_32;
  allocator<char> local_31;
  allocator<char> local_30;
  allocator<char> local_2f;
  allocator<char> local_2e;
  allocator<char> local_2d [16];
  allocator<char> local_1d;
  int local_1c;
  void *pvStack_18;
  int iteration_local;
  SampleQualifierRenderCase *this_local;
  
  local_1c = iteration;
  pvStack_18 = this;
  this_local = (SampleQualifierRenderCase *)__return_storage_ptr__;
  if (iteration == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Test with float varying",&local_1d);
    std::allocator<char>::~allocator(&local_1d);
  }
  else if (iteration == 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Test with vec2 varying",local_2d);
    std::allocator<char>::~allocator(local_2d);
  }
  else if (iteration == 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Test with vec3 varying",&local_2e);
    std::allocator<char>::~allocator(&local_2e);
  }
  else if (iteration == 3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Test with vec4 varying",&local_2f);
    std::allocator<char>::~allocator(&local_2f);
  }
  else if (iteration == 4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Test with array varying",&local_30);
    std::allocator<char>::~allocator(&local_30);
  }
  else if (iteration == 5) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Test with struct varying",&local_31);
    std::allocator<char>::~allocator(&local_31);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_32);
    std::allocator<char>::~allocator(&local_32);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string	SampleQualifierRenderCase::getIterationDescription (int iteration) const
{
	if (iteration == 0)
		return "Test with float varying";
	else if (iteration == 1)
		return "Test with vec2 varying";
	else if (iteration == 2)
		return "Test with vec3 varying";
	else if (iteration == 3)
		return "Test with vec4 varying";
	else if (iteration == 4)
		return "Test with array varying";
	else if (iteration == 5)
		return "Test with struct varying";

	DE_ASSERT(false);
	return "";
}